

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O0

bool loadViewerProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program_00;
  char *pcVar3;
  FILE *pFVar4;
  FILE *pf;
  char buf [1024];
  GLuint *program;
  djg_program *djp;
  
  program_00 = djgp_create();
  fprintf(_stdout,"Loading {Viewer-Program}\n");
  fflush(_stdout);
  if ((0 < g_framebuffer.aa) && (g_framebuffer.aa < 5)) {
    djgp_push_string(program_00,"#define MSAA_FACTOR %i\n",
                     (ulong)(uint)(1 << ((byte)g_framebuffer.aa & 0x1f)));
  }
  if (g_sphere.shading.mode == 2) {
    djgp_push_string(program_00,"#define FLAG_TONEMAP 1\n");
  }
  pcVar3 = strcat2((char *)&pf,g_app.dir.shader,"viewer.glsl");
  pFVar4 = fopen(pcVar3,"r");
  if (pFVar4 == (FILE *)0x0) {
    abort();
  }
  pcVar3 = strcat2((char *)&pf,g_app.dir.shader,"viewer.glsl");
  djgp_push_file(program_00,pcVar3);
  bVar1 = djgp_to_gl(program_00,0x1c2,false,true,g_gl.programs);
  if (bVar1) {
    djgp_release(program_00);
    g_gl.uniforms[0] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_FramebufferSampler");
    g_gl.uniforms[1] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_Viewport");
    configureViewerProgram();
    GVar2 = (*glad_glGetError)();
    djp._7_1_ = GVar2 == 0;
  }
  else {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    djgp_release(program_00);
    djp._7_1_ = false;
  }
  return djp._7_1_;
}

Assistant:

bool loadViewerProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_VIEWER];
    char buf[1024];

    LOG("Loading {Viewer-Program}\n");
    if (g_framebuffer.aa >= AA_MSAA2 && g_framebuffer.aa <= AA_MSAA16)
        djgp_push_string(djp, "#define MSAA_FACTOR %i\n", 1 << g_framebuffer.aa);
    if (g_sphere.shading.mode == SHADING_BRDF)
        djgp_push_string(djp, "#define FLAG_TONEMAP 1\n");

    FILE *pf = fopen(strcat2(buf, g_app.dir.shader, "viewer.glsl"), "r");
    if (!pf) abort();

    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "viewer.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_VIEWER_FRAMEBUFFER_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_FramebufferSampler");
    g_gl.uniforms[UNIFORM_VIEWER_VIEWPORT] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_Viewport");

    configureViewerProgram();

    return (glGetError() == GL_NO_ERROR);
}